

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

ON_ComponentManifestItem * __thiscall
ON_ComponentManifest::ItemFromNameHash
          (ON_ComponentManifest *this,Type component_type,ON_NameHash *component_name_hash)

{
  ON_ComponentManifestItem_PRIVATE *local_40;
  ON_ComponentManifestItem_PRIVATE *local_38;
  ON_ComponentManifestItem_PRIVATE *item;
  ON_NameHash *component_name_hash_local;
  Type component_type_local;
  ON_ComponentManifest *this_local;
  
  if (this->m_impl == (ON_ComponentManifestImpl *)0x0) {
    local_38 = (ON_ComponentManifestItem_PRIVATE *)0x0;
  }
  else {
    local_38 = ON_ComponentManifestImpl::ItemFromNameHash
                         (this->m_impl,component_type,component_name_hash);
  }
  if (local_38 == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    local_40 = (ON_ComponentManifestItem_PRIVATE *)&ON_ComponentManifestItem::UnsetItem;
  }
  else {
    local_40 = local_38;
  }
  return &local_40->super_ON_ComponentManifestItem;
}

Assistant:

const class ON_ComponentManifestItem& ON_ComponentManifest::ItemFromNameHash(
  ON_ModelComponent::Type component_type,
  const ON_NameHash& component_name_hash
  ) const
{
  const ON_ComponentManifestItem_PRIVATE* item
    = (nullptr != m_impl)
    ? m_impl->ItemFromNameHash(component_type,component_name_hash)
    : nullptr;
  return
    (nullptr != item )
    ? *item
    : ON_ComponentManifestItem::UnsetItem;
}